

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_parser.cpp
# Opt level: O0

void __thiscall MdParser::parse(MdParser *this)

{
  bool bVar1;
  bool bVar2;
  Document *this_00;
  istream *piVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  CodeParagraph *this_01;
  CodeLineElement *this_02;
  QuoteParagraph *this_03;
  Title1Paragraph *this_04;
  Title2Paragraph *this_05;
  long lVar7;
  bool local_4fa;
  bool local_4c2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  byte local_329;
  string local_328 [32];
  string local_308;
  string local_2e8;
  byte local_2c3;
  byte local_2c2;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  string local_278;
  byte local_253;
  byte local_252;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  char local_202 [2];
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  string local_148;
  string local_128 [32];
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  char local_a1;
  undefined1 local_a0 [8];
  regex olist1_regex;
  smatch match;
  size_t sharps;
  LineElement *last_e;
  Paragraph *temp_p;
  Paragraph *current_p;
  undefined1 local_30 [8];
  string line;
  MdParser *this_local;
  
  line.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  this_00 = (Document *)operator_new(0x38);
  Document::Document(this_00,(string *)&this->field_0x8);
  *(Document **)&this->field_0x230 = this_00;
  temp_p = (Paragraph *)0x0;
  sharps = 0;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&olist1_regex._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_a0,"^[0-9]+\\) ",0x10);
  do {
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&this->field_0x28,(string *)local_30);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) {
        if ((temp_p != (Paragraph *)0x0) && (lVar7 = Paragraph::size(), lVar7 != 0)) {
          Document::append_paragraph(*(Paragraph **)&this->field_0x230);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_a0);
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&olist1_regex._M_automaton.
                             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
        std::__cxx11::string::~string((string *)local_30);
        return;
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) break;
      if ((temp_p != (Paragraph *)0x0) && (lVar7 = Paragraph::size(), lVar7 != 0)) {
        Document::append_paragraph(*(Paragraph **)&this->field_0x230);
      }
      temp_p = (Paragraph *)operator_new(0x28);
      *(undefined8 *)((TextParagraph *)temp_p + 0x10) = 0;
      *(undefined8 *)((TextParagraph *)temp_p + 0x18) = 0;
      *(undefined8 *)temp_p = 0;
      *(undefined8 *)((TextParagraph *)temp_p + 8) = 0;
      *(undefined8 *)((TextParagraph *)temp_p + 0x20) = 0;
      TextParagraph::TextParagraph((TextParagraph *)temp_p);
    }
    local_a1 = '#';
    sVar5 = anon_unknown.dwarf_4bca7::string_startswith((string *)local_30,&local_a1);
    if (temp_p == (Paragraph *)0x0) {
      temp_p = (Paragraph *)operator_new(0x28);
      *(undefined8 *)((TextParagraph *)temp_p + 0x10) = 0;
      *(undefined8 *)((TextParagraph *)temp_p + 0x18) = 0;
      *(undefined8 *)temp_p = 0;
      *(undefined8 *)((TextParagraph *)temp_p + 8) = 0;
      *(undefined8 *)((TextParagraph *)temp_p + 0x20) = 0;
      TextParagraph::TextParagraph((TextParagraph *)temp_p);
    }
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)local_30);
    bVar1 = std::operator==(&local_c8,"    ");
    if (bVar1) {
LAB_0016c429:
      bVar1 = true;
      if (temp_p != (Paragraph *)0x0) {
        lVar7 = Paragraph::size();
        bVar1 = lVar7 == 0;
      }
    }
    else {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
      bVar1 = false;
      if (*pcVar6 == '\t') goto LAB_0016c429;
    }
    std::__cxx11::string::~string((string *)&local_c8);
    if (bVar1) {
      if (temp_p != (Paragraph *)0x0) {
        Paragraph::~Paragraph(temp_p);
        operator_delete(temp_p,0x28);
      }
      this_01 = (CodeParagraph *)operator_new(0x28);
      CodeParagraph::CodeParagraph(this_01);
      std::__cxx11::string::substr((ulong)&local_e8,(ulong)local_30);
      bVar1 = std::operator==(&local_e8,"    ");
      std::__cxx11::string::~string((string *)&local_e8);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_108,(ulong)local_30);
        std::__cxx11::string::operator=((string *)local_30,local_108);
        std::__cxx11::string::~string(local_108);
      }
      else {
        std::__cxx11::string::substr((ulong)local_128,(ulong)local_30);
        std::__cxx11::string::operator=((string *)local_30,local_128);
        std::__cxx11::string::~string(local_128);
      }
      this_02 = (CodeLineElement *)operator_new(0x28);
      CodeLineElement::CodeLineElement(this_02,(string *)local_30);
      (*(code *)**(undefined8 **)this_01)(this_01,this_02);
      Document::append_paragraph(*(Paragraph **)&this->field_0x230);
      temp_p = (Paragraph *)operator_new(0x28);
      *(undefined8 *)((TextParagraph *)temp_p + 0x10) = 0;
      *(undefined8 *)((TextParagraph *)temp_p + 0x18) = 0;
      *(undefined8 *)temp_p = 0;
      *(undefined8 *)((TextParagraph *)temp_p + 8) = 0;
      *(undefined8 *)((TextParagraph *)temp_p + 0x20) = 0;
      TextParagraph::TextParagraph((TextParagraph *)temp_p);
    }
    else if (sVar5 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,">",&local_191);
      bVar2 = anon_unknown.dwarf_4bca7::string_startswith((string *)local_30,&local_190);
      bVar1 = false;
      if ((bVar2) && (bVar1 = true, temp_p != (Paragraph *)0x0)) {
        lVar7 = Paragraph::size();
        bVar1 = lVar7 == 0;
      }
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      if (bVar1) {
        if (temp_p != (Paragraph *)0x0) {
          Paragraph::~Paragraph(temp_p);
          operator_delete(temp_p,0x28);
        }
        this_03 = (QuoteParagraph *)operator_new(0x28);
        QuoteParagraph::QuoteParagraph(this_03);
        std::__cxx11::string::substr((ulong)local_1b8,(ulong)local_30);
        lVar7 = std::__cxx11::string::find_first_not_of((char *)local_1b8,0x197eeb);
        std::__cxx11::string::~string(local_1b8);
        if (lVar7 == -1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8," ",&local_1d9);
          parse_line(this,(Paragraph *)this_03,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_200,(ulong)local_30);
          parse_line(this,(Paragraph *)this_03,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
        }
        Document::append_paragraph(*(Paragraph **)&this->field_0x230);
        temp_p = (Paragraph *)operator_new(0x28);
        *(undefined8 *)((TextParagraph *)temp_p + 0x10) = 0;
        *(undefined8 *)((TextParagraph *)temp_p + 0x18) = 0;
        *(undefined8 *)temp_p = 0;
        *(undefined8 *)((TextParagraph *)temp_p + 8) = 0;
        *(undefined8 *)((TextParagraph *)temp_p + 0x20) = 0;
        TextParagraph::TextParagraph((TextParagraph *)temp_p);
      }
      else {
        local_202[1] = 0x3d;
        bVar1 = anon_unknown.dwarf_4bca7::string_has_only((string *)local_30,local_202 + 1);
        if (bVar1) {
          this_04 = (Title1Paragraph *)operator_new(0x28);
          Title1Paragraph::Title1Paragraph(this_04,temp_p);
          if (temp_p != (Paragraph *)0x0) {
            Paragraph::~Paragraph(temp_p);
            operator_delete(temp_p,0x28);
          }
          temp_p = (Paragraph *)0x0;
          Document::append_paragraph(*(Paragraph **)&this->field_0x230);
        }
        else {
          local_202[0] = '-';
          bVar1 = anon_unknown.dwarf_4bca7::string_has_only((string *)local_30,local_202);
          if (bVar1) {
            this_05 = (Title2Paragraph *)operator_new(0x28);
            Title2Paragraph::Title2Paragraph(this_05,temp_p);
            if (temp_p != (Paragraph *)0x0) {
              Paragraph::~Paragraph(temp_p);
              operator_delete(temp_p,0x28);
            }
            temp_p = (Paragraph *)0x0;
            Document::append_paragraph(*(Paragraph **)&this->field_0x230);
          }
          else {
            std::allocator<char>::allocator();
            local_252 = 0;
            local_253 = 0;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"* ",&local_229)
            ;
            bVar1 = anon_unknown.dwarf_4bca7::string_startswith((string *)local_30,&local_228);
            local_4c2 = true;
            if (!bVar1) {
              std::allocator<char>::allocator();
              local_252 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_250,"- ",&local_251);
              local_253 = 1;
              local_4c2 = anon_unknown.dwarf_4bca7::string_startswith((string *)local_30,&local_250)
              ;
            }
            if ((local_253 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_250);
            }
            if ((local_252 & 1) != 0) {
              std::allocator<char>::~allocator(&local_251);
            }
            std::__cxx11::string::~string((string *)&local_228);
            std::allocator<char>::~allocator(&local_229);
            if (local_4c2 == false) {
              std::allocator<char>::allocator();
              local_2c2 = 0;
              local_2c3 = 0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_298,"  * ",&local_299);
              bVar1 = anon_unknown.dwarf_4bca7::string_startswith((string *)local_30,&local_298);
              local_4fa = true;
              if (!bVar1) {
                std::allocator<char>::allocator();
                local_2c2 = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2c0,"  - ",&local_2c1);
                local_2c3 = 1;
                local_4fa = anon_unknown.dwarf_4bca7::string_startswith
                                      ((string *)local_30,&local_2c0);
              }
              if ((local_2c3 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_2c0);
              }
              if ((local_2c2 & 1) != 0) {
                std::allocator<char>::~allocator(&local_2c1);
              }
              std::__cxx11::string::~string((string *)&local_298);
              std::allocator<char>::~allocator(&local_299);
              if (local_4fa == false) {
                bVar1 = std::
                        regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_30,
                                   (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)&olist1_regex._M_automaton.
                                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount,
                                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_a0,
                                   0);
                if (bVar1) {
                  lVar7 = Paragraph::size();
                  if (lVar7 != 0) {
                    Document::append_paragraph(*(Paragraph **)&this->field_0x230);
                  }
                  temp_p = (Paragraph *)operator_new(0x28);
                  OList1Paragraph::OList1Paragraph((OList1Paragraph *)temp_p);
                  std::__cxx11::string::find_first_not_of(local_30,0x197ef3);
                  std::__cxx11::string::substr((ulong)&local_308,(ulong)local_30);
                  parse_line(this,temp_p,&local_308);
                  std::__cxx11::string::~string((string *)&local_308);
                }
                else {
                  local_329 = 0;
                  lVar7 = Paragraph::size();
                  bVar1 = false;
                  if ((lVar7 != 0) && (bVar1 = false, sharps != 0)) {
                    (**(code **)(*(long *)sharps + 0x10))(local_328);
                    local_329 = 1;
                    pcVar6 = (char *)std::__cxx11::string::back();
                    bVar1 = false;
                    if (*pcVar6 != ' ') {
                      pcVar6 = (char *)std::__cxx11::string::front();
                      bVar1 = *pcVar6 != ' ';
                    }
                  }
                  if ((local_329 & 1) != 0) {
                    std::__cxx11::string::~string(local_328);
                  }
                  if (bVar1) {
                    std::operator+(&local_350," ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_30);
                    std::__cxx11::string::operator=((string *)local_30,(string *)&local_350);
                    std::__cxx11::string::~string((string *)&local_350);
                  }
                  sharps = (size_t)parse_line(this,temp_p,(string *)local_30);
                }
              }
              else {
                lVar7 = Paragraph::size();
                if (lVar7 != 0) {
                  Document::append_paragraph(*(Paragraph **)&this->field_0x230);
                }
                temp_p = (Paragraph *)operator_new(0x28);
                UList2Paragraph::UList2Paragraph((UList2Paragraph *)temp_p);
                std::__cxx11::string::substr((ulong)&local_2e8,(ulong)local_30);
                parse_line(this,temp_p,&local_2e8);
                std::__cxx11::string::~string((string *)&local_2e8);
              }
            }
            else {
              lVar7 = Paragraph::size();
              if (lVar7 != 0) {
                Document::append_paragraph(*(Paragraph **)&this->field_0x230);
              }
              temp_p = (Paragraph *)operator_new(0x28);
              UList1Paragraph::UList1Paragraph((UList1Paragraph *)temp_p);
              std::__cxx11::string::substr((ulong)&local_278,(ulong)local_30);
              parse_line(this,temp_p,&local_278);
              std::__cxx11::string::~string((string *)&local_278);
            }
          }
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"\t #",&local_169);
      anon_unknown.dwarf_4bca7::string_clear_leading(&local_148,(string *)local_30,&local_168);
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      if (sVar5 == 1) {
        if (temp_p != (Paragraph *)0x0) {
          Paragraph::~Paragraph(temp_p);
          operator_delete(temp_p,0x28);
        }
        temp_p = (Paragraph *)operator_new(0x28);
        Title1Paragraph::Title1Paragraph((Title1Paragraph *)temp_p);
      }
      else if (sVar5 == 2) {
        if (temp_p != (Paragraph *)0x0) {
          Paragraph::~Paragraph(temp_p);
          operator_delete(temp_p,0x28);
        }
        temp_p = (Paragraph *)operator_new(0x28);
        Title2Paragraph::Title2Paragraph((Title2Paragraph *)temp_p);
      }
      else if (sVar5 == 3) {
        if (temp_p != (Paragraph *)0x0) {
          Paragraph::~Paragraph(temp_p);
          operator_delete(temp_p,0x28);
        }
        temp_p = (Paragraph *)operator_new(0x28);
        Title3Paragraph::Title3Paragraph((Title3Paragraph *)temp_p);
      }
      parse_line(this,temp_p,(string *)local_30);
    }
  } while( true );
}

Assistant:

void MdParser::parse() {
	std::string line;
	_document = new Document(_filename);
	Paragraph *current_p(nullptr), *temp_p(nullptr);
	LineElement *last_e = nullptr;
	size_t sharps(0);

	smatch match;
	regex olist1_regex("^[0-9]+\\) ");

	while (getline(_input_file, line)) {
		if (line.empty()) {
			// end of line, change paragraph
			if (current_p and current_p->size()) {
				_document->append_paragraph(current_p);
			}
			current_p = new TextParagraph();
		} else {
			sharps = string_startswith(line, '#');

			if (!current_p) {
				current_p = new TextParagraph();
			}

			if ( (line.substr(0, 4) == "    " or line[0] == '\t') and (!current_p or !current_p->size()) ) {
				// This is a code paragraph
				delete current_p;
				current_p = new CodeParagraph();
				if (line.substr(0, 4) == "    ") {
					line = line.substr(4);
				} else {
					line = line.substr(1);
				}
				current_p->append_line_element(new CodeLineElement(line));
				_document->append_paragraph(current_p);
				current_p = new TextParagraph();
			} else if (sharps != 0) {
				line = string_clear_leading(line, "\t #");
				switch(sharps) {
					case 1:
						delete current_p;
						current_p = new Title1Paragraph();
						break;
					case 2:
						delete current_p;
						current_p = new Title2Paragraph();
						break;
					case 3:
						delete current_p;
						current_p = new Title3Paragraph();
						break;
					default:
						break;
				}
				parse_line(current_p, line);
			} else if (string_startswith(line, ">") and (!current_p or !current_p->size())) {
				delete current_p;
				current_p = new QuoteParagraph();
				if (line.substr(1).find_first_not_of("\t ") == string::npos) {
					parse_line(current_p, " ");
				} else {
					parse_line(current_p, line.substr(2));
				}
				_document->append_paragraph(current_p);
				current_p = new TextParagraph();
			} else if (string_has_only(line, '=')) { // title 1 delimiter
				temp_p = new Title1Paragraph(current_p);
				delete current_p;
				current_p = nullptr;
				_document->append_paragraph(temp_p);
			} else if (string_has_only(line, '-')) { // title 2 delimiter
				temp_p = new Title2Paragraph(current_p);
				delete current_p;
				current_p = nullptr;
				_document->append_paragraph(temp_p);
			} else if (string_startswith(line, "* ") or string_startswith(line, "- ")) { // level 1 list delimiter
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new UList1Paragraph();
				parse_line(current_p, line.substr(2));
			} else if (string_startswith(line, "  * ") or string_startswith(line, "  - ")) { // level 2 list delimiter
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new UList2Paragraph();
				parse_line(current_p, line.substr(4));
			} else if (regex_search(line, match, olist1_regex)) { // ordered list level 1
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new OList1Paragraph();
				parse_line(current_p, line.substr(line.find_first_not_of("0123456789)")+1));
			} else {
				// other content
				if (current_p->size() && last_e && (last_e->content()).back() != ' ' && line.front() != ' ') {
					line = " "+line;
				}
				last_e = parse_line(current_p, line);
			}
		}
	}

	if (current_p and current_p->size()) {
		_document->append_paragraph(current_p);
	}
}